

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f8484::MmuTest_set_membanks_Test::TestBody(MmuTest_set_membanks_Test *this)

{
  IMmu *pIVar1;
  _Head_base<0UL,_n_e_s::core::test::MockMemBank_*,_false> _Var2;
  TypedExpectation<bool_(unsigned_short)> *this_00;
  pointer *__ptr;
  _Head_base<0UL,_n_e_s::core::test::MockMemBank_*,_false> local_b8;
  MatcherBase<unsigned_char> local_b0;
  MemBankList mem_banks;
  ReturnAction<bool> local_58;
  Action<bool_(unsigned_short)> local_48;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  local_28;
  
  std::make_unique<n_e_s::core::test::MockMemBank>();
  _Var2._M_head_impl = local_b8._M_head_impl;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,0x4d2);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_b0,'*');
  n_e_s::core::test::MockMemBank::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&mem_banks,_Var2._M_head_impl,
             (Matcher<unsigned_short> *)&local_48,(Matcher<unsigned_char> *)&local_b0);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&mem_banks,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
             ,0x5f,"*mem_bank","write_byte(1234u, 42u)");
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
                *)&mem_banks.
                   super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_b0);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_48);
  _Var2._M_head_impl = local_b8._M_head_impl;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_b0,0x4d2);
  n_e_s::core::test::MockMemBank::gmock_is_address_in_range
            ((MockSpec<bool_(unsigned_short)> *)&mem_banks,_Var2._M_head_impl,
             (Matcher<unsigned_short> *)&local_b0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<bool_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<bool_(unsigned_short)> *)&mem_banks,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                       ,0x60,"*mem_bank","is_address_in_range(1234u)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_58,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_48,(ReturnAction *)&local_58);
  testing::internal::TypedExpectation<bool_(unsigned_short)>::WillOnce(this_00,&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &mem_banks.
              super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_b0);
  mem_banks.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mem_banks.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mem_banks.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::
  emplace_back<std::unique_ptr<n_e_s::core::test::MockMemBank,std::default_delete<n_e_s::core::test::MockMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)&mem_banks,
             (unique_ptr<n_e_s::core::test::MockMemBank,_std::default_delete<n_e_s::core::test::MockMemBank>_>
              *)&local_b8);
  local_28.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       mem_banks.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       mem_banks.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       mem_banks.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  mem_banks.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mem_banks.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mem_banks.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*((this->super_MmuTest).mmu._M_t.
     super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
     super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
     super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl)->_vptr_IMmu[2])();
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_28);
  pIVar1 = (this->super_MmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IMmu[4])(pIVar1,0x4d2,0x2a);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&mem_banks);
  if (local_b8._M_head_impl != (MockMemBank *)0x0) {
    (*((local_b8._M_head_impl)->super_IMemBank)._vptr_IMemBank[1])();
  }
  return;
}

Assistant:

TEST_F(MmuTest, set_membanks) {
    auto mem_bank = std::make_unique<MockMemBank>();

    EXPECT_CALL(*mem_bank, write_byte(1234u, 42u));
    EXPECT_CALL(*mem_bank, is_address_in_range(1234u))
            .WillOnce(testing::Return(true));

    MemBankList mem_banks;
    mem_banks.emplace_back(std::move(mem_bank));
    mmu->set_mem_banks(std::move(mem_banks));

    mmu->write_byte(1234u, 42u);
}